

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O1

long fd_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  __off_t _Var1;
  int __whence;
  int __fd;
  int *out;
  long lVar2;
  
  lVar2 = 1;
  if (0x67 < cmd) {
    if (cmd < 0x80) {
      if (cmd == 0x68) {
        if (b->shutdown != 0) {
          if (b->init != 0) {
            close(b->num);
          }
          b->init = 0;
        }
        b->num = *ptr;
        b->shutdown = (int)num;
        b->init = 1;
        return 1;
      }
      if (cmd == 0x69) {
        if (b->init != 0) {
          if (ptr != (void *)0x0) {
            *(int *)ptr = b->num;
          }
          return (long)b->num;
        }
        return -1;
      }
    }
    else {
      if (cmd == 0x80) goto LAB_00469430;
      if (cmd == 0x85) goto switchD_004693d6_caseD_3;
    }
    goto switchD_004693d6_caseD_2;
  }
  switch(cmd) {
  case 1:
    num = 0;
LAB_00469430:
    if (b->init != 0) {
      __fd = b->num;
      __whence = 0;
LAB_0046943e:
      _Var1 = lseek(__fd,num,__whence);
      return _Var1;
    }
    break;
  case 3:
switchD_004693d6_caseD_3:
    if (b->init != 0) {
      __fd = b->num;
      num = 0;
      __whence = 1;
      goto LAB_0046943e;
    }
    break;
  case 8:
    return (long)b->shutdown;
  case 9:
    b->shutdown = (int)num;
  case 0xb:
    goto switchD_004693d6_caseD_b;
  }
switchD_004693d6_caseD_2:
  lVar2 = 0;
switchD_004693d6_caseD_b:
  return lVar2;
}

Assistant:

static long fd_ctrl(BIO *b, int cmd, long num, void *ptr) {
  switch (cmd) {
    case BIO_CTRL_RESET:
      num = 0;
      [[fallthrough]];
    case BIO_C_FILE_SEEK:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, num, SEEK_SET);
      }
      return 0;
    case BIO_C_FILE_TELL:
    case BIO_CTRL_INFO:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, 0, SEEK_CUR);
      }
      return 0;
    case BIO_C_SET_FD:
      fd_free(b);
      b->num = *static_cast<int *>(ptr);
      b->shutdown = static_cast<int>(num);
      b->init = 1;
      return 1;
    case BIO_C_GET_FD:
      if (b->init) {
        int *out = static_cast<int *>(ptr);
        if (out != nullptr) {
          *out = b->num;
        }
        return b->num;
      } else {
        return -1;
      }
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}